

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> * __thiscall
cmGeneratorTarget::GetUtilityItems(cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  cmLinkItem local_58;
  
  if (this->UtilityItemsDone == false) {
    this->UtilityItemsDone = true;
    p_Var3 = (this->Target->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(this->Target->Utilities)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      do {
        pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse
                           (this->LocalGenerator,(string *)(p_Var3 + 1));
        paVar1 = &local_58.super_string.field_2;
        local_58.super_string._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,*(long *)(p_Var3 + 1),
                   (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
        local_58.Target = pcVar2;
        std::
        _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
        ::_M_insert_unique<cmLinkItem>(&(this->UtilityItems)._M_t,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.super_string._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.super_string._M_dataplus._M_p,
                          local_58.super_string.field_2._M_allocated_capacity + 1);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var4);
    }
  }
  return &this->UtilityItems;
}

Assistant:

std::set<cmLinkItem> const& cmGeneratorTarget::GetUtilityItems() const
{
  if (!this->UtilityItemsDone) {
    this->UtilityItemsDone = true;
    std::set<std::string> const& utilities = this->GetUtilities();
    for (std::set<std::string>::const_iterator i = utilities.begin();
         i != utilities.end(); ++i) {
      cmGeneratorTarget* gt =
        this->LocalGenerator->FindGeneratorTargetToUse(*i);
      this->UtilityItems.insert(cmLinkItem(*i, gt));
    }
  }
  return this->UtilityItems;
}